

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

void Vec_StrPutS_(Vec_Str_t *vOut,char *Val)

{
  char *Val_local;
  Vec_Str_t *vOut_local;
  
  Vec_StrPutS(vOut,Val);
  return;
}

Assistant:

static inline void Vec_StrPutS_( Vec_Str_t * vOut, char * Val )  { Vec_StrPutS( vOut, Val );  }